

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O2

string * __thiscall
cmCMakeHostSystemInformationCommand::ValueToString_abi_cxx11_
          (string *__return_storage_ptr__,cmCMakeHostSystemInformationCommand *this,char *value)

{
  char *pcVar1;
  allocator local_9;
  
  pcVar1 = "";
  if (value != (char *)0x0) {
    pcVar1 = value;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCMakeHostSystemInformationCommand
::ValueToString(const char *value) const
{
  std::string safe_string = value ? value : "";
  return safe_string;
}